

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O0

bool __thiscall AV1Kmeans::AV1KmeansTest1::CheckResult(AV1KmeansTest1 *this,int n)

{
  int in_ESI;
  long in_RDI;
  int idx;
  uint local_18;
  
  local_18 = 0;
  while( true ) {
    if (in_ESI <= (int)local_18) {
      return true;
    }
    if (*(char *)(in_RDI + 0x202c + (long)(int)local_18) !=
        *(char *)(in_RDI + 0x302c + (long)(int)local_18)) break;
    local_18 = local_18 + 1;
  }
  printf("%d ",(ulong)local_18);
  printf("%d != %d ",(ulong)*(byte *)(in_RDI + 0x202c + (long)(int)local_18),
         (ulong)*(byte *)(in_RDI + 0x302c + (long)(int)local_18));
  return false;
}

Assistant:

bool CheckResult(int n) {
    for (int idx = 0; idx < n; ++idx) {
      if (indices1_[idx] != indices2_[idx]) {
        printf("%d ", idx);
        printf("%d != %d ", indices1_[idx], indices2_[idx]);
        return false;
      }
    }
    return true;
  }